

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int take_off(void)

{
  obj *poVar1;
  obj *poVar2;
  obj *poVar3;
  obj *poVar4;
  obj *poVar5;
  obj *poVar6;
  obj *poVar7;
  int iVar8;
  char *pcVar9;
  obj **ppoVar10;
  long lVar11;
  obj *poVar12;
  ulong uVar13;
  
  poVar12 = uarm;
  poVar7 = uarmu;
  poVar6 = uarmc;
  poVar5 = uarmh;
  poVar4 = uarms;
  poVar3 = uarmg;
  poVar2 = uarmf;
  poVar1 = uamul;
  if (taking_off == 0) goto LAB_00188a48;
  if (0 < todelay) {
    todelay = todelay + -1;
    return 1;
  }
  if (taking_off < 0x100) {
    if (taking_off < 0x10) {
      switch(taking_off) {
      case 1:
        iVar8 = cursed(uarm);
        if (iVar8 == 0) {
          Armor_off();
        }
        break;
      case 2:
        iVar8 = cursed(uarmc);
        poVar12 = poVar6;
        if (iVar8 == 0) {
          Cloak_off();
        }
        break;
      default:
        goto switchD_001887b8_caseD_3;
      case 4:
        iVar8 = cursed(uarmh);
        poVar12 = poVar5;
        if (iVar8 == 0) {
          Helmet_off();
        }
        break;
      case 8:
        iVar8 = cursed(uarms);
        poVar12 = poVar4;
        if (iVar8 == 0) {
          Shield_off();
        }
      }
    }
    else if (taking_off == 0x10) {
      iVar8 = cursed(uarmg);
      poVar12 = poVar3;
      if (iVar8 == 0) {
        Gloves_off();
      }
    }
    else if (taking_off == 0x20) {
      iVar8 = cursed(uarmf);
      poVar12 = poVar2;
      if (iVar8 == 0) {
        Boots_off();
      }
    }
    else {
      if (taking_off != 0x40) goto switchD_001887b8_caseD_3;
      iVar8 = cursed(uarmu);
      poVar12 = poVar7;
      if (iVar8 == 0) {
        Shirt_off();
      }
    }
LAB_00188a13:
    if (poVar12 != (obj *)0x0) {
      off_msg(poVar12,'\x01');
    }
  }
  else if (taking_off < 0x10000) {
    if (taking_off == 0x100) {
      iVar8 = cursed(uwep);
      if (iVar8 == 0) {
        setuwep((obj *)0x0);
        pcVar9 = body_part(7);
        pline("You are empty %s.",pcVar9);
        goto LAB_001889e8;
      }
    }
    else if (taking_off == 0x200) {
      setuqwep((obj *)0x0);
      pline("You no longer have ammunition readied.");
    }
    else {
      if (taking_off != 0x400) goto switchD_001887b8_caseD_3;
      setuswapwep((obj *)0x0);
      pline("You no longer have a second weapon readied.");
LAB_001889e8:
      u.twoweap = '\0';
    }
  }
  else {
    if (taking_off < 0x40000) {
      if (taking_off == 0x10000) {
        iVar8 = cursed(uamul);
        poVar12 = poVar1;
        if (iVar8 == 0) {
          Amulet_off();
        }
        goto LAB_00188a13;
      }
      if (taking_off == 0x20000) {
        ppoVar10 = &uleft;
        goto LAB_00188977;
      }
    }
    else {
      if (taking_off == 0x40000) {
        ppoVar10 = &uright;
LAB_00188977:
        poVar12 = *ppoVar10;
        iVar8 = cursed(poVar12);
        if (iVar8 == 0) {
          Ring_off_or_gone(*ppoVar10,'\0');
        }
        goto LAB_00188a13;
      }
      if (taking_off == 0x80000) {
        iVar8 = cursed(ublindf);
        if (iVar8 == 0) {
          Blindf_off(ublindf,'\x01');
        }
        goto LAB_00188a25;
      }
    }
switchD_001887b8_caseD_3:
    warning("do_takeoff: taking off %lx");
  }
LAB_00188a25:
  takeoff_mask = ~taking_off & takeoff_mask;
  taking_off = 0;
LAB_00188a48:
  uVar13 = 0x80000;
  lVar11 = 1;
  do {
    if ((takeoff_mask & uVar13) != 0) {
      todelay = 0;
      taking_off = uVar13;
      if ((long)uVar13 < 0x40) {
        switch(uVar13) {
        case 0:
          goto switchD_00188af7_caseD_0;
        case 1:
          poVar12 = uarm;
          if (uarmc != (obj *)0x0) {
            iVar8 = objects[uarmc->otyp].oc_delay * 2;
LAB_00188ce9:
            todelay = iVar8 + 1;
          }
          goto LAB_00188c32;
        case 2:
          ppoVar10 = &uarmc;
          break;
        case 3:
        case 5:
        case 6:
        case 7:
switchD_00188af7_caseD_3:
          warning("take_off: taking off %lx");
          return 0;
        case 4:
          ppoVar10 = &uarmh;
          break;
        case 8:
          ppoVar10 = &uarms;
          break;
        default:
          if (uVar13 == 0x10) {
            ppoVar10 = &uarmg;
          }
          else {
            if (uVar13 != 0x20) goto switchD_00188af7_caseD_3;
            ppoVar10 = &uarmf;
          }
        }
        poVar12 = *ppoVar10;
LAB_00188c32:
        if (poVar12 != (obj *)0x0) {
          todelay = todelay + objects[poVar12->otyp].oc_delay;
        }
        iVar8 = todelay;
        if (todelay < 1) goto LAB_00188c63;
      }
      else {
        iVar8 = 1;
        if ((long)uVar13 < 0x10000) {
          if ((long)uVar13 < 0x200) {
            if (uVar13 == 0x40) {
              if (uarm != (obj *)0x0) {
                todelay = objects[uarm->otyp].oc_delay * 2;
              }
              poVar12 = uarmu;
              if (uarmc != (obj *)0x0) {
                iVar8 = todelay + objects[uarmc->otyp].oc_delay * 2;
                goto LAB_00188ce9;
              }
              goto LAB_00188c32;
            }
            if (uVar13 != 0x100) goto switchD_00188af7_caseD_3;
          }
          else if ((uVar13 != 0x200) && (uVar13 != 0x400)) goto switchD_00188af7_caseD_3;
        }
        else if ((long)uVar13 < 0x40000) {
          if ((uVar13 != 0x10000) && (uVar13 != 0x20000)) goto switchD_00188af7_caseD_3;
        }
        else if (uVar13 != 0x40000) {
          if (uVar13 != 0x80000) goto switchD_00188af7_caseD_3;
          iVar8 = 2;
        }
      }
      todelay = iVar8 + -1;
LAB_00188c63:
      set_occupation(take_off,disrobing,0);
      return 1;
    }
    uVar13 = takeoff_order[lVar11];
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0xf);
switchD_00188af7_caseD_0:
  todelay = 0;
  pline("You finish %s.",disrobing);
  return 0;
}

Assistant:

static int take_off(void)
{
	int i;
	struct obj *otmp;

	if (taking_off) {
	    if (todelay > 0) {
		todelay--;
		return 1;	/* still busy */
	    } else {
		if ((otmp = do_takeoff())) off_msg(otmp, TRUE);
	    }
	    takeoff_mask &= ~taking_off;
	    taking_off = 0L;
	}

	for (i = 0; takeoff_order[i]; i++)
	    if (takeoff_mask & takeoff_order[i]) {
		taking_off = takeoff_order[i];
		break;
	    }

	otmp = NULL;
	todelay = 0;

	if (taking_off == 0L) {
	  pline("You finish %s.", disrobing);
	  return 0;
	} else if (taking_off == W_WEP) {
	  todelay = 1;
	} else if (taking_off == W_SWAPWEP) {
	  todelay = 1;
	} else if (taking_off == W_QUIVER) {
	  todelay = 1;
	} else if (taking_off == WORN_ARMOR) {
	  otmp = uarm;
	  /* If a cloak is being worn, add the time to take it off and put
	   * it back on again.  Kludge alert! since that time is 0 for all
	   * known cloaks, add 1 so that it actually matters...
	   */
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_CLOAK) {
	  otmp = uarmc;
	} else if (taking_off == WORN_BOOTS) {
	  otmp = uarmf;
	} else if (taking_off == WORN_GLOVES) {
	  otmp = uarmg;
	} else if (taking_off == WORN_HELMET) {
	  otmp = uarmh;
	} else if (taking_off == WORN_SHIELD) {
	  otmp = uarms;
	} else if (taking_off == WORN_SHIRT) {
	  otmp = uarmu;
	  /* add the time to take off and put back on armor and/or cloak */
	  if (uarm)  todelay += 2 * objects[uarm->otyp].oc_delay;
	  if (uarmc) todelay += 2 * objects[uarmc->otyp].oc_delay + 1;
	} else if (taking_off == WORN_AMUL) {
	  todelay = 1;
	} else if (taking_off == LEFT_RING) {
	  todelay = 1;
	} else if (taking_off == RIGHT_RING) {
	  todelay = 1;
	} else if (taking_off == WORN_BLINDF) {
	  todelay = 2;
	} else {
	  warning("take_off: taking off %lx", taking_off);
	  return 0;	/* force done */
	}

	if (otmp) todelay += objects[otmp->otyp].oc_delay;

	/* Since setting the occupation now starts the counter next move, that
	 * would always produce a delay 1 too big per item unless we subtract
	 * 1 here to account for it.
	 */
	if (todelay > 0) todelay--;

	set_occupation(take_off, disrobing, 0);
	return 1;		/* get busy */
}